

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void skiwi::anon_unknown_26::compile_variable_arity_rest_arg
               (asmcode *code,compiler_options *ops,size_t arg_pos)

{
  skiwi *psVar1;
  vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *pvVar2;
  size_type sVar3;
  const_reference pvVar4;
  long lVar5;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  operand local_34c;
  operation local_348;
  operand local_344;
  operation local_340;
  operand local_33c;
  operation local_338;
  operand local_334 [2];
  operation local_32c [2];
  operand local_324 [2];
  operation local_31c;
  operand local_318 [3];
  operation local_30c [2];
  operand local_304 [2];
  operation local_2fc [2];
  operand local_2f4;
  operation local_2f0 [4];
  operand local_2e0;
  operation local_2dc [2];
  operand local_2d4 [2];
  operation local_2cc;
  operand local_2c8 [3];
  operation local_2bc;
  operand local_2b8 [2];
  operation local_2b0 [2];
  operand local_2a8 [2];
  operation local_2a0;
  operand local_29c [3];
  operation local_290 [2];
  operand local_288 [2];
  operation local_280 [2];
  operand local_278 [2];
  operation local_270;
  operand local_26c [2];
  operation local_264;
  operand local_260 [2];
  operation local_258 [2];
  unsigned_long local_250;
  operand local_248 [2];
  operation local_240 [2];
  operand local_238 [2];
  operation local_230;
  operand local_22c;
  operation local_228;
  operand local_224 [2];
  operation local_21c [3];
  operand local_210 [2];
  operation local_208;
  operand local_204 [3];
  operation local_1f8 [2];
  operand local_1f0;
  operation local_1ec;
  operand local_1e8 [2];
  operation local_1e0 [2];
  operand local_1d8 [2];
  operation local_1d0;
  operand local_1cc [3];
  operation local_1c0 [2];
  operand local_1b8 [2];
  operation local_1b0 [2];
  operand local_1a8 [2];
  operation local_1a0;
  operand local_19c [2];
  operation local_194;
  int local_190;
  int local_18c;
  int i;
  int max_iter;
  operand local_180 [2];
  operation local_178;
  operand local_174 [3];
  operation local_168 [2];
  operand local_160;
  operation local_15c;
  operand local_158 [2];
  operation local_150;
  operand local_14c [2];
  operation local_144;
  uint64_t local_140;
  uint64_t header;
  operand local_130 [2];
  operation local_128;
  operand local_124 [2];
  operation local_11c;
  operand local_118 [2];
  operation local_110 [2];
  operand local_108 [2];
  operation local_100;
  operand local_fc [2];
  operation local_f4;
  operand local_f0;
  operation local_ec;
  operand local_e8;
  operation local_e4 [2];
  operand local_dc;
  operation local_d8 [2];
  operand local_d0 [2];
  operation local_c8 [3];
  operand local_bc [2];
  operation local_b4;
  undefined1 local_b0 [8];
  string repeat;
  string done2;
  undefined1 local_60 [8];
  string done;
  string not_empty;
  size_t arg_pos_local;
  compiler_options *ops_local;
  asmcode *code_local;
  
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&done.field_2 + 8),psVar1,arg_pos);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_60,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&repeat.field_2 + 8),psVar1,lab_00);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_b0,psVar1,lab_01);
  local_b4 = CMP;
  local_bc[1] = 0x14;
  local_bc[0] = NUMBER;
  local_c8[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_b4,local_bc + 1,local_bc,(int *)(local_c8 + 2));
  local_c8[1] = 0x3b;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_c8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  local_c8[0] = MOV;
  local_d0[1] = 9;
  local_d0[0] = NUMBER;
  local_d8[1] = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_c8,local_d0 + 1,local_d0,(int *)(local_d8 + 1));
  local_d8[0] = JMP;
  local_dc = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_d8,&local_dc);
  local_e4[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_e4 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  local_e4[0] = PUSH;
  local_e8 = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_e4,&local_e8);
  local_ec = PUSH;
  local_f0 = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_ec,&local_f0);
  if ((ops->safe_primitives & 1U) != 0) {
    local_f4 = MOV;
    local_fc[1] = 9;
    local_fc[0] = R11;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,&local_f4,local_fc + 1,local_fc);
    local_100 = SHL;
    local_108[1] = 9;
    local_108[0] = NUMBER;
    local_110[1] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_100,local_108 + 1,local_108,(int *)(local_110 + 1));
    local_110[0] = ADD;
    local_118[1] = 9;
    local_118[0] = R11;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_110,local_118 + 1,local_118);
    check_heap(code,re_list_heap_overflow);
  }
  local_11c = MOV;
  local_124[1] = 0x18;
  local_124[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_11c,local_124 + 1,local_124);
  local_128 = OR;
  local_130[1] = 0x18;
  local_130[0] = NUMBER;
  header._4_4_ = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_128,local_130 + 1,local_130,(int *)((long)&header + 4));
  local_140 = make_block_header(2,T_PAIR);
  local_144 = MOV;
  local_14c[1] = 9;
  local_14c[0] = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,&local_144,local_14c + 1,local_14c,&local_140);
  local_150 = MOV;
  local_158[1] = 0x20;
  local_158[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_150,local_158 + 1,local_158);
  pvVar2 = get_argument_registers();
  sVar3 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
          size(pvVar2);
  if (arg_pos < sVar3) {
    local_15c = MOV;
    local_160 = MEM_RBP;
    local_168[1] = 8;
    pvVar2 = get_argument_registers();
    pvVar4 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
             ::operator[](pvVar2,arg_pos);
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand_const&>
              (code,&local_15c,&local_160,(int *)(local_168 + 1),pvVar4);
  }
  else {
    pvVar2 = get_argument_registers();
    sVar3 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
            size(pvVar2);
    load_local(code,arg_pos - sVar3,RDX,RCX);
    local_168[0] = MOV;
    local_174[2] = 0x20;
    local_174[1] = 8;
    local_174[0] = RDX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
              (code,local_168,local_174 + 2,(int *)(local_174 + 1),local_174);
  }
  local_178 = CMP;
  local_180[1] = 0x14;
  local_180[0] = NUMBER;
  max_iter = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_178,local_180 + 1,local_180,&max_iter);
  i = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&i,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  local_18c = 6;
  for (local_190 = 1; local_190 < local_18c; local_190 = local_190 + 1) {
    local_194 = MOV;
    local_19c[1] = 0xb;
    local_19c[0] = RBP;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,&local_194,local_19c + 1,local_19c);
    local_1a0 = ADD;
    local_1a8[1] = 0xb;
    local_1a8[0] = NUMBER;
    local_1b0[1] = 0x18;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_1a0,local_1a8 + 1,local_1a8,(int *)(local_1b0 + 1));
    local_1b0[0] = OR;
    local_1b8[1] = 0xb;
    local_1b8[0] = NUMBER;
    local_1c0[1] = 5;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_1b0,local_1b8 + 1,local_1b8,(int *)(local_1c0 + 1));
    local_1c0[0] = MOV;
    local_1cc[2] = 0x20;
    local_1cc[1] = 0x10;
    local_1cc[0] = RCX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
              (code,local_1c0,local_1cc + 2,(int *)(local_1cc + 1),local_1cc);
    local_1d0 = ADD;
    local_1d8[1] = 0x10;
    local_1d8[0] = NUMBER;
    local_1e0[1] = 0x18;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_1d0,local_1d8 + 1,local_1d8,(int *)(local_1e0 + 1));
    local_1e0[0] = MOV;
    local_1e8[1] = 0x20;
    local_1e8[0] = RAX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_1e0,local_1e8 + 1,local_1e8);
    lVar5 = (long)local_190;
    pvVar2 = get_argument_registers();
    sVar3 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
            size(pvVar2);
    if (arg_pos + lVar5 < sVar3) {
      local_1ec = MOV;
      local_1f0 = MEM_RBP;
      local_1f8[1] = 8;
      pvVar2 = get_argument_registers();
      pvVar4 = std::
               vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
               operator[](pvVar2,arg_pos + (long)local_190);
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand_const&>
                (code,&local_1ec,&local_1f0,(int *)(local_1f8 + 1),pvVar4);
    }
    else {
      lVar5 = (long)local_190;
      pvVar2 = get_argument_registers();
      sVar3 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
              ::size(pvVar2);
      load_local(code,(arg_pos + lVar5) - sVar3,RDX,RCX);
      local_1f8[0] = MOV;
      local_204[2] = 0x20;
      local_204[1] = 8;
      local_204[0] = RDX;
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                (code,local_1f8,local_204 + 2,(int *)(local_204 + 1),local_204);
    }
    local_208 = CMP;
    local_210[1] = 0x14;
    local_210[0] = NUMBER;
    local_21c[2] = local_190 + 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_208,local_210 + 1,local_210,(int *)(local_21c + 2));
    local_21c[1] = 0x2f;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_21c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  }
  local_21c[0] = SUB;
  local_224[1] = 0x14;
  local_224[0] = NUMBER;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int&>
            (code,local_21c,local_224 + 1,local_224,&local_18c);
  local_228 = PUSH;
  local_22c = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_228,&local_22c);
  local_230 = MOV;
  local_238[1] = 0xc;
  local_238[0] = MEM_R10;
  local_240[1] = 0x88;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_230,local_238 + 1,local_238,(int *)(local_240 + 1));
  local_240[0] = ADD;
  local_248[1] = 0xc;
  local_248[0] = NUMBER;
  lVar5 = (long)local_18c;
  pvVar2 = get_argument_registers();
  sVar3 = std::vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>::
          size(pvVar2);
  local_250 = ((arg_pos + lVar5) - sVar3) * 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_240,local_248 + 1,local_248,&local_250);
  local_258[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_258 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  local_258[0] = MOV;
  local_260[1] = 0xd;
  local_260[0] = MEM_RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_258,local_260 + 1,local_260);
  local_264 = MOV;
  local_26c[1] = 0xb;
  local_26c[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_264,local_26c + 1,local_26c);
  local_270 = ADD;
  local_278[1] = 0xb;
  local_278[0] = NUMBER;
  local_280[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_270,local_278 + 1,local_278,(int *)(local_280 + 1));
  local_280[0] = OR;
  local_288[1] = 0xb;
  local_288[0] = NUMBER;
  local_290[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_280,local_288 + 1,local_288,(int *)(local_290 + 1));
  local_290[0] = MOV;
  local_29c[2] = 0x20;
  local_29c[1] = 0x10;
  local_29c[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_290,local_29c + 2,(int *)(local_29c + 1),local_29c);
  local_2a0 = ADD;
  local_2a8[1] = 0x10;
  local_2a8[0] = NUMBER;
  local_2b0[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_2a0,local_2a8 + 1,local_2a8,(int *)(local_2b0 + 1));
  local_2b0[0] = MOV;
  local_2b8[1] = 0x20;
  local_2b8[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_2b0,local_2b8 + 1,local_2b8);
  local_2bc = MOV;
  local_2c8[2] = 0x20;
  local_2c8[1] = 8;
  local_2c8[0] = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_2bc,local_2c8 + 2,(int *)(local_2c8 + 1),local_2c8);
  local_2cc = ADD;
  local_2d4[1] = 0xc;
  local_2d4[0] = NUMBER;
  local_2dc[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_2cc,local_2d4 + 1,local_2d4,(int *)(local_2dc + 1));
  local_2dc[0] = DEC;
  local_2e0 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_2dc,&local_2e0);
  local_2f0[3] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_2f0 + 3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&repeat.field_2 + 8));
  local_2f0[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_2f0 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  local_2f0[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_2f0 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&repeat.field_2 + 8));
  local_2f0[0] = POP;
  local_2f4 = RSI;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_2f0,&local_2f4);
  local_2fc[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_2fc + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  local_2fc[0] = MOV;
  local_304[1] = 9;
  local_304[0] = NUMBER;
  local_30c[1] = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_2fc,local_304 + 1,local_304,(int *)(local_30c + 1));
  local_30c[0] = MOV;
  local_318[2] = 0x20;
  local_318[1] = 0x10;
  local_318[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_30c,local_318 + 2,(int *)(local_318 + 1),local_318);
  local_31c = ADD;
  local_324[1] = 0x10;
  local_324[0] = NUMBER;
  local_32c[1] = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_31c,local_324 + 1,local_324,(int *)(local_32c + 1));
  local_32c[0] = MOV;
  local_334[1] = 9;
  local_334[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_32c,local_334 + 1,local_334);
  local_338 = POP;
  local_33c = RDX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_338,&local_33c);
  local_340 = POP;
  local_344 = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_340,&local_344);
  local_348 = JMP;
  local_34c = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_348,&local_34c);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)(repeat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(done.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compile_variable_arity_rest_arg(asmcode& code, const compiler_options& ops, size_t arg_pos)
    {
    std::string not_empty = label_to_string(label++);
    std::string done = label_to_string(label++);
    std::string done2 = label_to_string(label++);
    std::string repeat = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
    code.add(asmcode::JGS, not_empty);
    code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, nil);
    code.add(asmcode::JMP, CONTINUE);
    code.add(asmcode::LABEL, not_empty);
    code.add(asmcode::PUSH, asmcode::RCX);
    code.add(asmcode::PUSH, asmcode::RDX);
    if (ops.safe_primitives)
      {
      code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);
      code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 1);
      code.add(asmcode::ADD, asmcode::RAX, asmcode::R11); // shl 1 and add for * 3
      check_heap(code, re_list_heap_overflow);
      }
    code.add(asmcode::MOV, asmcode::R15, ALLOC);
    code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);

    uint64_t header = make_block_header(2, T_PAIR);
    code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);

    code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);

    if (arg_pos < get_argument_registers().size())
      {
      code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), get_argument_registers()[arg_pos]);
      }
    else
      {
      load_local(code, arg_pos - get_argument_registers().size(), asmcode::RDX, asmcode::RCX);
      code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RDX);
      }
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JE, done);

    int max_iter = 6;
    for (int i = 1; i < max_iter; ++i)
      {
      code.add(asmcode::MOV, asmcode::RCX, ALLOC);
      code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(3));
      code.add(asmcode::OR, asmcode::RCX, asmcode::NUMBER, block_tag);
      code.add(asmcode::MOV, MEM_ALLOC, CELLS(2), asmcode::RCX);
      code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(3));
      code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);

      if ((arg_pos + i) < get_argument_registers().size())
        {
        code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), get_argument_registers()[arg_pos + i]);
        }
      else
        {
        load_local(code, arg_pos + i - get_argument_registers().size(), asmcode::RDX, asmcode::RCX);
        code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RDX);
        }
      code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, i + 1);
      code.add(asmcode::JE, done);
      }

    code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, max_iter);

    code.add(asmcode::PUSH, asmcode::RSI);

    code.add(asmcode::MOV, asmcode::RDX, LOCAL);
    code.add(asmcode::ADD, asmcode::RDX, asmcode::NUMBER, CELLS((arg_pos + max_iter - get_argument_registers().size())));
    code.add(asmcode::LABEL, repeat);
    code.add(asmcode::MOV, asmcode::RSI, asmcode::MEM_RDX);

    code.add(asmcode::MOV, asmcode::RCX, ALLOC);
    code.add(asmcode::ADD, asmcode::RCX, asmcode::NUMBER, CELLS(3));
    code.add(asmcode::OR, asmcode::RCX, asmcode::NUMBER, block_tag);
    code.add(asmcode::MOV, MEM_ALLOC, CELLS(2), asmcode::RCX);
    code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(3));
    code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
    code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RSI);
    code.add(asmcode::ADD, asmcode::RDX, asmcode::NUMBER, CELLS(1));
    code.add(asmcode::DEC, asmcode::R11);
    code.add(asmcode::JES, done2);
    code.add(asmcode::JMPS, repeat);

    code.add(asmcode::LABEL, done2);
    code.add(asmcode::POP, asmcode::RSI);

    code.add(asmcode::LABEL, done);
    code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, nil);
    code.add(asmcode::MOV, MEM_ALLOC, CELLS(2), asmcode::RAX);
    code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(3));
    code.add(asmcode::MOV, asmcode::RAX, asmcode::R15);
    code.add(asmcode::POP, asmcode::RDX);
    code.add(asmcode::POP, asmcode::RCX);
    code.add(asmcode::JMP, CONTINUE);
    }